

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

void FAudioVoice_GetChannelVolumes(FAudioVoice *voice,uint32_t Channels,float *pVolumes)

{
  undefined8 in_RDX;
  uint in_ESI;
  long in_RDI;
  
  FAudio_PlatformLockMutex((FAudioMutex)0x128402);
  SDL_memcpy(in_RDX,*(undefined8 *)(in_RDI + 0xb0),(ulong)in_ESI << 2);
  FAudio_PlatformUnlockMutex((FAudioMutex)0x128432);
  return;
}

Assistant:

void FAudioVoice_GetChannelVolumes(
	FAudioVoice *voice,
	uint32_t Channels,
	float *pVolumes
) {
	LOG_API_ENTER(voice->audio)
	FAudio_PlatformLockMutex(voice->volumeLock);
	LOG_MUTEX_LOCK(voice->audio, voice->volumeLock)
	FAudio_memcpy(
		pVolumes,
		voice->channelVolume,
		sizeof(float) * Channels
	);
	FAudio_PlatformUnlockMutex(voice->volumeLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->volumeLock)
	LOG_API_EXIT(voice->audio)
}